

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::
     TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  Vector *pVVar1;
  char *pcVar2;
  long lVar3;
  StringStatisticsState *string_stats;
  string_t target_value;
  undefined8 local_50;
  char *local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  lVar3 = chunk_end - chunk_start;
  if (chunk_start <= chunk_end && lVar3 != 0) {
    pVVar1 = col + chunk_start * 0x10 + 8;
    do {
      local_50 = *(ulong *)(pVVar1 + -8);
      local_48 = *(char **)pVVar1;
      local_40._0_8_ = local_50;
      local_40.pointer.ptr = local_48;
      StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_40.pointer);
      local_40.pointer.length = (undefined4)local_50;
      (*(code *)**(undefined8 **)mask)(mask,&local_40,4);
      pcVar2 = (char *)((long)&local_50 + 4);
      if (0xc < (local_50 & 0xffffffff)) {
        pcVar2 = local_48;
      }
      (*(code *)**(undefined8 **)mask)(mask,pcVar2);
      pVVar1 = pVVar1 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}